

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QString * escapeHtml(QString *__return_storage_ptr__,QString *input)

{
  char16_t cVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  int iVar4;
  storage_type *psVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  longlong lVar9;
  char *__s;
  QByteArrayView QVar10;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pDVar2 = (input->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (input->d).ptr;
  lVar7 = (input->d).size;
  (__return_storage_ptr__->d).size = lVar7;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    lVar7 = (__return_storage_ptr__->d).size;
  }
  if (0 < lVar7) {
    lVar9 = 0;
    iVar8 = 0;
    do {
      cVar1 = (__return_storage_ptr__->d).ptr[lVar9];
      iVar4 = 1;
      if ((ushort)cVar1 < 0x3c) {
        if (cVar1 == L'\"') {
          __s = "&quot;";
          goto LAB_001157c3;
        }
        __s = "&amp;";
        if (cVar1 == L'&') goto LAB_001157c3;
      }
      else {
        if (cVar1 == L'>') {
          __s = "&gt;";
        }
        else {
          if (cVar1 != L'<') goto LAB_0011586d;
          __s = "&lt;";
        }
LAB_001157c3:
        psVar5 = (storage_type *)strlen(__s);
        QVar10.m_data = psVar5;
        QVar10.m_size = (qsizetype)&local_48;
        QString::fromLatin1(QVar10);
        pQVar3 = local_48;
        local_38 = 0;
        uStack_40 = 0;
        local_48 = (QArrayData *)0x0;
        QString::replace((longlong)__return_storage_ptr__,lVar9,(QString *)0x1);
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,8);
          }
        }
        sVar6 = strlen(__s);
        iVar4 = (int)sVar6;
        lVar7 = (__return_storage_ptr__->d).size;
      }
LAB_0011586d:
      iVar8 = iVar8 + iVar4;
      lVar9 = (longlong)iVar8;
    } while (lVar9 < lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

QString escapeHtml(const QString& input)
{
	QString escaped(input);
	for (int i=0; i < escaped.length();) {
		const char* replacement = 0;
		ushort ch = escaped.at(i).unicode();
		if (ch == '&') {
			replacement = "&amp;";
		} else if (ch == '<') {
			replacement = "&lt;";
		} else if (ch == '>') {
			replacement = "&gt;";
		} else if (ch == '"') {
			replacement = "&quot;";
		}
		if (replacement) {
			escaped.replace(i, 1, QLatin1String(replacement));
			i += (int)strlen(replacement);
		} else {
			++i;
		}
	}
	return escaped;
}